

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall fasttext::SoftmaxLoss::computeOutput(SoftmaxLoss *this,State *state)

{
  int iVar1;
  real *prVar2;
  int64_t iVar3;
  float *pfVar4;
  Vector *in_RSI;
  double dVar5;
  int32_t i_2;
  int32_t i_1;
  int32_t i;
  int32_t osz;
  real z;
  real max;
  Vector *output;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  int local_30;
  int local_2c;
  int local_28;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar6;
  float fVar7;
  float in_stack_ffffffffffffffe4;
  real rVar8;
  Matrix *A;
  
  A = (Matrix *)(in_RSI + 2);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  Vector::mul(in_RSI,A,(Vector *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  prVar2 = Vector::operator[]((Vector *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
  rVar8 = *prVar2;
  fVar6 = 0.0;
  iVar3 = Vector::size((Vector *)0x1d1066);
  iVar1 = (int)iVar3;
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
    pfVar4 = std::max<float>(prVar2,(float *)&stack0xffffffffffffffe4);
    rVar8 = *pfVar4;
  }
  for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
    dVar5 = exp((double)(*prVar2 - rVar8));
    in_stack_ffffffffffffffc4 = (float)dVar5;
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
    *prVar2 = in_stack_ffffffffffffffc4;
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
    fVar6 = *prVar2 + fVar6;
  }
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    fVar7 = fVar6;
    prVar2 = Vector::operator[]((Vector *)CONCAT44(in_stack_ffffffffffffffc4,fVar6),
                                in_stack_ffffffffffffffb8);
    *prVar2 = *prVar2 / fVar6;
    fVar6 = fVar7;
  }
  return;
}

Assistant:

void SoftmaxLoss::computeOutput(Model::State& state) const {
  Vector& output = state.output;
  output.mul(*wo_, state.hidden);
  real max = output[0], z = 0.0;
  int32_t osz = output.size();
  for (int32_t i = 0; i < osz; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] /= z;
  }
}